

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::JoinRelation::GetTableRef(JoinRelation *this)

{
  undefined1 uVar1;
  JoinType JVar2;
  bool bVar3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar6;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var7;
  Relation *pRVar8;
  pointer pJVar9;
  pointer pPVar10;
  long in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *col;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  templated_unique_single_t join_ref;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_40;
  __uniq_ptr_impl<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
  super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl =
       (tuple<duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>)operator_new(0xc0);
  uVar1 = *(undefined1 *)(in_RSI + 0xa9);
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 8) = 3;
  *(_func_int ***)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x10) =
       (_func_int **)
       ((long)local_38._M_t.
              super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
              super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x20);
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x18) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x20) = 0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x30) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x38) =
       (_func_int *)0xffffffffffffffff;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x60) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x50) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x58) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x40) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x48) = (_func_int *)0x0;
  *(undefined ***)
   local_38._M_t.super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
   super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl = &PTR__JoinRef_024935a8;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x78) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x68) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x70) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x80) = 3;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x81) = uVar1;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xb8) = 0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xa8) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xb0) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x98) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xa0) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x88) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x90) = (_func_int *)0x0;
  pRVar8 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x68));
  (*pRVar8->_vptr_Relation[7])(&local_40,pRVar8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  _Var7._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (TableRef *)0x0;
  _Var4._M_head_impl =
       (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var4._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
  }
  if (local_40._M_head_impl != (TableRef *)0x0) {
    (*(local_40._M_head_impl)->_vptr_TableRef[1])();
  }
  pRVar8 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x78));
  (*pRVar8->_vptr_Relation[7])(&local_40,pRVar8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  _Var7._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (TableRef *)0x0;
  _Var4._M_head_impl =
       (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var4._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_TableRef + 8))();
  }
  if (local_40._M_head_impl != (TableRef *)0x0) {
    (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
  }
  if (*(long *)(in_RSI + 0x88) != 0) {
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)(in_RSI + 0x88));
    (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar10);
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_38);
    _Var4._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (TableRef *)0x0;
    _Var5._M_head_impl =
         (pJVar9->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar9->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)_Var4._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_40._M_head_impl != (TableRef *)0x0) {
      (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
    }
  }
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pJVar9->using_columns,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RSI + 0x90));
  JVar2 = *(JoinType *)(in_RSI + 0xa8);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  pJVar9->type = JVar2;
  bVar3 = *(bool *)(in_RSI + 0xe0);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_38);
  pJVar9->delim_flipped = bVar3;
  this_00 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              **)(in_RSI + 200);
  puVar6 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)(in_RSI + 0xd0);
  if (this_00 != puVar6) {
    do {
      pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                         ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *
                          )&local_38);
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_00);
      (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar10);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pJVar9->duplicate_eliminated_columns,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_40);
      if (local_40._M_head_impl != (TableRef *)0x0) {
        (*((BaseExpression *)&(local_40._M_head_impl)->_vptr_TableRef)->_vptr_BaseExpression[1])();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar6);
  }
  (this->super_Relation)._vptr_Relation =
       (_func_int **)
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
       super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> JoinRelation::GetTableRef() {
	auto join_ref = make_uniq<JoinRef>(join_ref_type);
	join_ref->left = left->GetTableRef();
	join_ref->right = right->GetTableRef();
	if (condition) {
		join_ref->condition = condition->Copy();
	}
	join_ref->using_columns = using_columns;
	join_ref->type = join_type;
	join_ref->delim_flipped = delim_flipped;
	for (auto &col : duplicate_eliminated_columns) {
		join_ref->duplicate_eliminated_columns.emplace_back(col->Copy());
	}
	return std::move(join_ref);
}